

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_path(void)

{
  int iVar1;
  VALUE *pVVar2;
  VALUE *v;
  VALUE *pVVar3;
  VALUE *pVVar4;
  VALUE *pVVar5;
  VALUE *pVVar6;
  VALUE root;
  VALUE local_40;
  
  iVar1 = value_init_dict(&local_40);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3d7,"%s","value_init_dict(&root) == 0");
  pVVar2 = value_dict_get_or_add(&local_40,"foo");
  iVar1 = value_init_dict(pVVar2);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3d9,"%s","value_init_dict(foo) == 0");
  v = value_dict_get_or_add(pVVar2,"bar");
  iVar1 = value_init_array(v);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3db,"%s","value_init_array(bar) == 0");
  pVVar3 = value_array_append(v);
  acutest_check_((uint)(pVVar3 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3dc,"%s","value_array_append(bar) != NULL");
  pVVar3 = value_array_append(v);
  acutest_check_((uint)(pVVar3 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3dd,"%s","value_array_append(bar) != NULL");
  pVVar3 = value_array_append(v);
  acutest_check_((uint)(pVVar3 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3de,"%s","value_array_append(bar) != NULL");
  pVVar3 = value_array_get(v,0);
  pVVar4 = value_array_get(v,1);
  pVVar5 = value_array_get(v,2);
  pVVar6 = value_path((VALUE *)0x0,"");
  acutest_check_((uint)(pVVar6 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e3,"%s","value_path(NULL, \"\") == NULL");
  pVVar6 = value_path((VALUE *)0x0,"foo");
  acutest_check_((uint)(pVVar6 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e4,"%s","value_path(NULL, \"foo\") == NULL");
  pVVar6 = value_path(&local_40,"");
  acutest_check_((uint)(pVVar6 == &local_40),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e5,"%s","value_path(&root, \"\") == &root");
  pVVar6 = value_path(&local_40,"/");
  acutest_check_((uint)(pVVar6 == &local_40),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e6,"%s","value_path(&root, \"/\") == &root");
  pVVar6 = value_path(&local_40,"////");
  acutest_check_((uint)(pVVar6 == &local_40),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,999,"%s","value_path(&root, \"////\") == &root");
  pVVar6 = value_path(&local_40,"foo");
  acutest_check_((uint)(pVVar6 == pVVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,1000,"%s","value_path(&root, \"foo\") == foo");
  pVVar6 = value_path(&local_40,"/foo");
  acutest_check_((uint)(pVVar6 == pVVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e9,"%s","value_path(&root, \"/foo\") == foo");
  pVVar6 = value_path(&local_40,"/foo/");
  acutest_check_((uint)(pVVar6 == pVVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ea,"%s","value_path(&root, \"/foo/\") == foo");
  pVVar2 = value_path(&local_40,"foo/bar");
  acutest_check_((uint)(pVVar2 == v),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3eb,"%s","value_path(&root, \"foo/bar\") == bar");
  pVVar2 = value_path(&local_40,"//foo///bar///");
  acutest_check_((uint)(pVVar2 == v),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ec,"%s","value_path(&root, \"//foo///bar///\") == bar");
  pVVar2 = value_path(&local_40,"/foo/bar/");
  acutest_check_((uint)(pVVar2 == v),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ed,"%s","value_path(&root, \"/foo/bar/\") == bar");
  pVVar2 = value_path(&local_40,"/foo/bar/[0]");
  acutest_check_((uint)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ee,"%s","value_path(&root, \"/foo/bar/[0]\") == bar0");
  pVVar2 = value_path(&local_40,"/foo/bar/[1]");
  acutest_check_((uint)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ef,"%s","value_path(&root, \"/foo/bar/[1]\") == bar1");
  pVVar2 = value_path(&local_40,"/foo/bar/[2]");
  acutest_check_((uint)(pVVar2 == pVVar5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f0,"%s","value_path(&root, \"/foo/bar/[2]\") == bar2");
  pVVar2 = value_path(&local_40,"/foo/bar/[3]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f1,"%s","value_path(&root, \"/foo/bar/[3]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar/[-0]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f2,"%s","value_path(&root, \"/foo/bar/[-0]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar/[-1]");
  acutest_check_((uint)(pVVar2 == pVVar5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f3,"%s","value_path(&root, \"/foo/bar/[-1]\") == bar2");
  pVVar2 = value_path(&local_40,"/foo/bar/[-2]");
  acutest_check_((uint)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f4,"%s","value_path(&root, \"/foo/bar/[-2]\") == bar1");
  pVVar2 = value_path(&local_40,"/foo/bar/[-3]");
  acutest_check_((uint)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f5,"%s","value_path(&root, \"/foo/bar/[-3]\") == bar0");
  pVVar2 = value_path(&local_40,"/foo/bar/[]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f6,"%s","value_path(&root, \"/foo/bar/[]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar/[x]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f7,"%s","value_path(&root, \"/foo/bar/[x]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar/0");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f8,"%s","value_path(&root, \"/foo/bar/0\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar[0]");
  acutest_check_((uint)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f9,"%s","value_path(&root, \"/foo/bar[0]\") == bar0");
  pVVar2 = value_path(&local_40,"/foo/bar[1]");
  acutest_check_((uint)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fa,"%s","value_path(&root, \"/foo/bar[1]\") == bar1");
  pVVar2 = value_path(&local_40,"/foo/bar[2]");
  acutest_check_((uint)(pVVar2 == pVVar5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fb,"%s","value_path(&root, \"/foo/bar[2]\") == bar2");
  pVVar2 = value_path(&local_40,"/foo/bar[3]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fc,"%s","value_path(&root, \"/foo/bar[3]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar[-0]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fd,"%s","value_path(&root, \"/foo/bar[-0]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar[-1]");
  acutest_check_((uint)(pVVar2 == pVVar5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3fe,"%s","value_path(&root, \"/foo/bar[-1]\") == bar2");
  pVVar2 = value_path(&local_40,"/foo/bar[-2]");
  acutest_check_((uint)(pVVar2 == pVVar4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3ff,"%s","value_path(&root, \"/foo/bar[-2]\") == bar1");
  pVVar2 = value_path(&local_40,"/foo/bar[-3]");
  acutest_check_((uint)(pVVar2 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x400,"%s","value_path(&root, \"/foo/bar[-3]\") == bar0");
  pVVar2 = value_path(&local_40,"/foo/bar[]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x401,"%s","value_path(&root, \"/foo/bar[]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar[x]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x402,"%s","value_path(&root, \"/foo/bar[x]\") == NULL");
  pVVar2 = value_path(&local_40,"/foo/bar0");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x403,"%s","value_path(&root, \"/foo/bar0\") == NULL");
  pVVar2 = value_path(&local_40,"/[0]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x404,"%s","value_path(&root, \"/[0]\") == NULL");
  pVVar2 = value_path(&local_40,"[0]");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x405,"%s","value_path(&root, \"[0]\") == NULL");
  pVVar2 = value_path(&local_40,"xxx/yyy");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x406,"%s","value_path(&root, \"xxx/yyy\") == NULL");
  pVVar2 = value_path(&local_40,"foo/yyy");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x407,"%s","value_path(&root, \"foo/yyy\") == NULL");
  pVVar2 = value_path(&local_40,"xxx/foo");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x408,"%s","value_path(&root, \"xxx/foo\") == NULL");
  pVVar2 = value_path(&local_40,"xxx/bar");
  acutest_check_((uint)(pVVar2 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x409,"%s","value_path(&root, \"xxx/bar\") == NULL");
  value_fini(&local_40);
  return;
}

Assistant:

static void
test_path(void)
{
    VALUE root;
    VALUE* foo;
    VALUE* bar;
    VALUE* bar0;
    VALUE* bar1;
    VALUE* bar2;

    TEST_CHECK(value_init_dict(&root) == 0);
    foo = value_dict_get_or_add(&root, "foo");
    TEST_CHECK(value_init_dict(foo) == 0);
    bar = value_dict_get_or_add(foo, "bar");
    TEST_CHECK(value_init_array(bar) == 0);
    TEST_CHECK(value_array_append(bar) != NULL);
    TEST_CHECK(value_array_append(bar) != NULL);
    TEST_CHECK(value_array_append(bar) != NULL);
    bar0 = value_array_get(bar, 0);
    bar1 = value_array_get(bar, 1);
    bar2 = value_array_get(bar, 2);

    TEST_CHECK(value_path(NULL, "") == NULL);
    TEST_CHECK(value_path(NULL, "foo") == NULL);
    TEST_CHECK(value_path(&root, "") == &root);
    TEST_CHECK(value_path(&root, "/") == &root);
    TEST_CHECK(value_path(&root, "////") == &root);
    TEST_CHECK(value_path(&root, "foo") == foo);
    TEST_CHECK(value_path(&root, "/foo") == foo);
    TEST_CHECK(value_path(&root, "/foo/") == foo);
    TEST_CHECK(value_path(&root, "foo/bar") == bar);
    TEST_CHECK(value_path(&root, "//foo///bar///") == bar);
    TEST_CHECK(value_path(&root, "/foo/bar/") == bar);
    TEST_CHECK(value_path(&root, "/foo/bar/[0]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar/[1]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar/[2]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar/[3]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/[-0]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/[-1]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar/[-2]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar/[-3]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar/[]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/[x]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar/0") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[0]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar[1]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar[2]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar[3]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[-0]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[-1]") == bar2);
    TEST_CHECK(value_path(&root, "/foo/bar[-2]") == bar1);
    TEST_CHECK(value_path(&root, "/foo/bar[-3]") == bar0);
    TEST_CHECK(value_path(&root, "/foo/bar[]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar[x]") == NULL);
    TEST_CHECK(value_path(&root, "/foo/bar0") == NULL);
    TEST_CHECK(value_path(&root, "/[0]") == NULL);
    TEST_CHECK(value_path(&root, "[0]") == NULL);
    TEST_CHECK(value_path(&root, "xxx/yyy") == NULL);
    TEST_CHECK(value_path(&root, "foo/yyy") == NULL);
    TEST_CHECK(value_path(&root, "xxx/foo") == NULL);
    TEST_CHECK(value_path(&root, "xxx/bar") == NULL);

    value_fini(&root);
}